

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RtMidi.cpp
# Opt level: O3

string * __thiscall
RtMidi::getApiDisplayName_abi_cxx11_(string *__return_storage_ptr__,RtMidi *this,Api api)

{
  allocator<char> local_9;
  
  if ((uint)this < 6) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,rtmidi_api_names[(ulong)this & 0xffffffff][1],
               &local_9);
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"Unknown","");
  }
  return __return_storage_ptr__;
}

Assistant:

std::string RtMidi :: getApiDisplayName( RtMidi::Api api )
{
  if (api < 0 || api >= RtMidi::NUM_APIS)
    return "Unknown";
  return rtmidi_api_names[api][1];
}